

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O2

void recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  recv_cb_called = recv_cb_called + 1;
  return;
}

Assistant:

static void recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  ASSERT_GE(nread, 0);

  /* free and return if this is a mmsg free-only callback invocation */
  if (flags & UV_UDP_MMSG_FREE) {
    ASSERT_EQ(nread, 0);
    ASSERT_NULL(addr);
    free(rcvbuf->base);
    return;
  }

  ASSERT_EQ(nread, 4);
  ASSERT_NOT_NULL(addr);
  ASSERT_MEM_EQ("PING", rcvbuf->base, nread);

  recv_cb_called++;
  if (recv_cb_called == NUM_SENDS) {
    uv_close((uv_handle_t*)handle, close_cb);
    uv_close((uv_handle_t*)&sender, close_cb);
  }

  /* Don't free if the buffer could be reused via mmsg */
  if (rcvbuf && !(flags & UV_UDP_MMSG_CHUNK))
    free(rcvbuf->base);
}